

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klondike.c
# Opt level: O0

_Bool klondike_isWon(Board *board)

{
  Spot *pSVar1;
  Board *in_RDI;
  bool bVar2;
  Spot *foundation;
  uchar foundationCount;
  uchar i;
  byte local_24;
  byte local_11;
  
  if (((gConfig.game)->id == TRIPLEKLONDIKETURN1) || ((gConfig.game)->id == TRIPLEKLONDIKETURN3)) {
    local_24 = 0xc;
  }
  else {
    bVar2 = true;
    if ((gConfig.game)->id != DOUBLEKLONDIKETURN1) {
      bVar2 = (gConfig.game)->id == DOUBLEKLONDIKETURN3;
    }
    local_24 = 4;
    if (bVar2) {
      local_24 = 8;
    }
  }
  local_11 = 0;
  while( true ) {
    if (local_24 <= local_11) {
      return true;
    }
    pSVar1 = board_spotGet(in_RDI,FOUNDATION,local_11);
    if (pSVar1->cardsCount != '\r') break;
    local_11 = local_11 + 1;
  }
  return false;
}

Assistant:

bool klondike_isWon(Board * board)
{
	unsigned char i;
	unsigned char foundationCount = (gConfig.game->id==TRIPLEKLONDIKETURN1 || gConfig.game->id==TRIPLEKLONDIKETURN3 ? 12 : (gConfig.game->id==DOUBLEKLONDIKETURN1 || gConfig.game->id==DOUBLEKLONDIKETURN3 ? 8 : 4));
	Spot * foundation;
	for(i=0;i<foundationCount;i++)
	{
		foundation = board_spotGet(board, FOUNDATION, i);
		if(foundation->cardsCount!=13)
			return false;
	}

	return true;
}